

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int prvTidyDecodeUTF8BytesToChar
              (uint *c,uint firstByte,ctmbstr successorBytes,TidyInputSource *inp,int *count)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int tempCount;
  Bool BVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ctmbstr ptVar14;
  byte tempbuf [10];
  tmbchar local_3a [10];
  
  ptVar14 = successorBytes;
  if (successorBytes == (ctmbstr)0x0) {
    ptVar14 = local_3a;
  }
  if (firstByte == 0xffffffff) {
    *c = 0xffffffff;
    *count = 1;
    return 0;
  }
  uVar12 = 1;
  uVar11 = firstByte;
  if (firstByte < 0x80) {
    bVar4 = true;
    bVar3 = false;
  }
  else {
    if ((firstByte & 0xe0) == 0xc0) {
      uVar11 = firstByte & 0x1f;
      uVar12 = 2;
    }
    else if ((firstByte & 0xf0) == 0xe0) {
      uVar11 = firstByte & 0xf;
      uVar12 = 3;
    }
    else {
      if ((firstByte & 0xf8) != 0xf0) {
        if ((firstByte & 0xfc) == 0xf8) {
          uVar11 = firstByte & 3;
          uVar12 = 5;
LAB_001373f1:
          bVar3 = true;
        }
        else {
          if ((firstByte & 0xfe) == 0xfc) {
            uVar11 = firstByte & 1;
            uVar12 = 6;
            goto LAB_001373f1;
          }
          bVar3 = false;
        }
        bVar4 = false;
        goto LAB_00137196;
      }
      uVar11 = firstByte & 7;
      uVar12 = 4;
    }
    bVar3 = true;
    bVar4 = true;
  }
LAB_00137196:
  if (successorBytes == (ctmbstr)0x0) {
    if (inp == (TidyInputSource *)0x0) {
      uVar8 = 1;
      uVar12 = 1;
      if (bVar3) goto LAB_001373be;
    }
    else if (bVar3) {
      uVar8 = 2;
      if (2 < uVar12) {
        uVar8 = uVar12;
      }
      uVar9 = 0;
      do {
        BVar5 = (*inp->eof)(inp->sourceData);
        if (BVar5 != no) break;
        uVar6 = (*inp->getByte)(inp->sourceData);
        ptVar14[uVar9] = (byte)uVar6;
        if ((uVar6 & 0xc0) != 0x80) {
          uVar8 = (int)uVar9 + 1;
          if (uVar6 != 0xffffffff) {
            (*inp->ungetByte)(inp->sourceData,(byte)uVar6);
          }
          goto LAB_001373be;
        }
        uVar11 = uVar6 & 0x3f | uVar11 << 6;
        uVar9 = uVar9 + 1;
      } while (uVar8 - 1 != uVar9);
    }
  }
  else if (bVar3) {
    uVar8 = 2;
    if (2 < uVar12) {
      uVar8 = uVar12;
    }
    uVar9 = 0;
    do {
      bVar1 = ptVar14[uVar9];
      if ((bVar1 == 0) || ((bVar1 & 0xc0) != 0x80)) {
        uVar8 = (int)uVar9 + 1;
        goto LAB_001373be;
      }
      uVar11 = bVar1 & 0x3f | uVar11 << 6;
      uVar9 = uVar9 + 1;
    } while (uVar8 - 1 != uVar9);
  }
  uVar8 = uVar12;
  if ((bVar4) && (uVar11 < 0x110000 && (uVar11 & 0xfffffffe) != 0xfffe)) {
    lVar10 = (long)offsetUTF8Sequences[uVar8 - 1];
    if (validUTF8[lVar10].lowChar <= uVar11) {
      iVar2 = offsetUTF8Sequences[uVar8];
      if (uVar11 <= (uint)offsetUTF8Sequences[(long)iVar2 * 5 + 4]) {
        iVar7 = -1;
        if (offsetUTF8Sequences[uVar8 - 1] < iVar2) {
          ptVar14 = local_3a;
          if (successorBytes != (ctmbstr)0x0) {
            ptVar14 = successorBytes;
          }
          lVar13 = lVar10 * 0x14 + 0x158e9d;
          bVar3 = true;
          do {
            bVar3 = !bVar3;
            uVar9 = 0;
            do {
              uVar12 = firstByte;
              if (uVar9 != 0) {
                uVar12 = (uint)(byte)ptVar14[uVar9 - 1];
              }
              if ((byte)uVar12 < *(byte *)(lVar13 + -1 + uVar9 * 2)) {
                if (!bVar3) {
LAB_00137366:
                  bVar3 = true;
                  iVar7 = -1;
                  goto LAB_00137371;
                }
              }
              else if (*(byte *)(lVar13 + uVar9 * 2) < (byte)uVar12 && !bVar3) goto LAB_00137366;
              uVar9 = uVar9 + 1;
              bVar3 = true;
            } while (uVar8 != uVar9);
            iVar7 = 0;
            bVar3 = false;
LAB_00137371:
            lVar10 = lVar10 + 1;
            lVar13 = lVar13 + 0x14;
          } while (lVar10 != iVar2);
        }
        *count = uVar8;
        *c = uVar11;
        return iVar7;
      }
    }
  }
LAB_001373be:
  *count = uVar8;
  *c = uVar11;
  return -1;
}

Assistant:

int TY_(DecodeUTF8BytesToChar)( uint* c, uint firstByte, ctmbstr successorBytes,
                                TidyInputSource* inp, int* count )
{
    byte tempbuf[10];
    byte *buf = &tempbuf[0];
    uint ch = 0, n = 0;
    int i, bytes = 0;
    Bool hasError = no;
    
    if ( successorBytes )
        buf = (byte*) successorBytes;
        
    /* special check if we have been passed an EOF char */
    if ( firstByte == EndOfStream )
    {
        /* at present */
        *c = firstByte;
        *count = 1;
        return 0;
    }

    ch = firstByte; /* first byte is passed in separately */
    
    if (ch <= 0x7F) /* 0XXX XXXX one byte */
    {
        n = ch;
        bytes = 1;
    }
    else if ((ch & 0xE0) == 0xC0)  /* 110X XXXX  two bytes */
    {
        n = ch & 31;
        bytes = 2;
    }
    else if ((ch & 0xF0) == 0xE0)  /* 1110 XXXX  three bytes */
    {
        n = ch & 15;
        bytes = 3;
    }
    else if ((ch & 0xF8) == 0xF0)  /* 1111 0XXX  four bytes */
    {
        n = ch & 7;
        bytes = 4;
    }
    else if ((ch & 0xFC) == 0xF8)  /* 1111 10XX  five bytes */
    {
        n = ch & 3;
        bytes = 5;
        hasError = yes;
    }
    else if ((ch & 0xFE) == 0xFC)  /* 1111 110X  six bytes */
    {
        n = ch & 1;
        bytes = 6;
        hasError = yes;
    }
    else
    {
        /* not a valid first byte of a UTF-8 sequence */
        n = ch;
        bytes = 1;
        hasError = yes;
    }

    /* successor bytes should have the form 10XX XXXX */

    /* If caller supplied buffer, use it.  Else see if caller
    ** supplied an input source, use that.
    */
    if ( successorBytes )
    {
        for ( i=0; i < bytes-1; ++i )
        {
            if ( !buf[i] || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( inp )
    {
        for ( i=0; i < bytes-1 && !inp->eof(inp->sourceData); ++i )
        {
            int b = inp->getByte( inp->sourceData );
            buf[i] = (tmbchar) b;

            /* End of data or illegal successor byte value */
            if ( b == EOF || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                if ( b != EOF )
                    inp->ungetByte( inp->sourceData, buf[i] );
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( bytes > 1 )
    {
        hasError = yes;
        bytes = 1;
    }
    
    if (!hasError && ((n == kUTF8ByteSwapNotAChar) || (n == kUTF8NotAChar)))
        hasError = yes;
        
    if (!hasError && (n > kMaxUTF8FromUCS4))
        hasError = yes;

    if (!hasError)
    {
        int lo, hi;
        
        lo = offsetUTF8Sequences[bytes - 1];
        hi = offsetUTF8Sequences[bytes] - 1;
        
        /* check for overlong sequences */
        if ((n < validUTF8[lo].lowChar) || (n > validUTF8[hi].highChar))
            hasError = yes;
        else
        {
            hasError = yes; /* assume error until proven otherwise */
        
            for (i = lo; i <= hi; i++)
            {
                int tempCount;
                byte theByte;
                
                for (tempCount = 0; tempCount < bytes; tempCount++)
                {
                    if (!tempCount)
                        theByte = (tmbchar) firstByte;
                    else
                        theByte = buf[tempCount - 1];
                        
                    if ( theByte >= validUTF8[i].validBytes[(tempCount * 2)] &&
                         theByte <= validUTF8[i].validBytes[(tempCount * 2) + 1] )
                        hasError = no;
                    if (hasError)
                        break;
                }
            }
        }
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
       /* debug */
       fprintf( stderr, "UTF-8 decoding error of %d bytes : ", bytes );
       fprintf( stderr, "0x%02x ", firstByte );
       for (i = 1; i < bytes; i++)
           fprintf( stderr, "0x%02x ", buf[i - 1] );
       fprintf( stderr, " = U+%04X\n", n );
    }
#endif

    *count = bytes;
    *c = n;
    if ( hasError )
        return -1;
    return 0;
}